

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O0

void special(void)

{
  rtosc_cmp_options *in_stack_00000008;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  rtosc_arg_val_t *in_stack_00000020;
  rtosc_arg_val_t *in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000040;
  char *in_stack_00000048;
  int in_stack_00000050;
  
  asn_special(l,r,'N');
  cmp_1(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
        in_stack_00000008,in_stack_00000040,in_stack_00000048,in_stack_00000050);
  asn_special(l,r,'F');
  cmp_1(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
        in_stack_00000008,in_stack_00000040,in_stack_00000048,in_stack_00000050);
  asn_special(l,r,'T');
  cmp_1(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
        in_stack_00000008,in_stack_00000040,in_stack_00000048,in_stack_00000050);
  asn_special(l,r,'I');
  cmp_1(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
        in_stack_00000008,in_stack_00000040,in_stack_00000048,in_stack_00000050);
  return;
}

Assistant:

void special()
{
    asn_special(l, r, 'N');
    cmp_1(eq, l, r, 1, 1, NULL, "nil", "nil", __LINE__);
    asn_special(l, r, 'F');
    cmp_1(eq, l, r, 1, 1, NULL, "false", "false", __LINE__);
    asn_special(l, r, 'T');
    cmp_1(eq, l, r, 1, 1, NULL, "true", "true", __LINE__);
    asn_special(l, r, 'I');
    cmp_1(eq, l, r, 1, 1, NULL, "inf", "inf", __LINE__);
}